

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O1

void start_pass(j_decompress_ptr cinfo)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  jpeg_error_mgr *pjVar3;
  int (*paiVar4) [64];
  jpeg_component_info *pjVar5;
  int iVar6;
  long lVar7;
  code *pcVar8;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var9;
  void *pvVar10;
  ulong uVar11;
  long lVar12;
  int (*paiVar13) [64];
  int iVar14;
  
  pjVar2 = cinfo->entropy;
  iVar1 = cinfo->Ss;
  if (cinfo->progressive_mode == 0) {
    if ((((iVar1 != 0) || (cinfo->Ah != 0)) || (cinfo->Al != 0)) || (cinfo->Se < 0x3f)) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x7a;
      (*pjVar3->emit_message)((j_common_ptr)cinfo,-1);
    }
    pcVar8 = decode_mcu;
    goto LAB_0013686e;
  }
  iVar14 = cinfo->Se;
  if (iVar1 == 0) {
    if (iVar14 == 0) goto LAB_00136695;
LAB_001366b2:
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x10;
    (pjVar3->msg_parm).i[0] = iVar1;
    (cinfo->err->msg_parm).i[1] = cinfo->Se;
    (cinfo->err->msg_parm).i[2] = cinfo->Ah;
    (cinfo->err->msg_parm).i[3] = cinfo->Al;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  else {
    if ((0x3f < iVar14 || iVar14 < iVar1) || (cinfo->comps_in_scan != 1)) goto LAB_001366b2;
LAB_00136695:
    if (((cinfo->Ah != 0) && (cinfo->Ah + -1 != cinfo->Al)) || (0xd < cinfo->Al)) goto LAB_001366b2;
  }
  if (0 < cinfo->comps_in_scan) {
    lVar12 = 0;
    do {
      iVar1 = cinfo->cur_comp_info[lVar12]->component_index;
      paiVar4 = cinfo->coef_bits;
      paiVar13 = paiVar4 + iVar1;
      iVar14 = cinfo->num_components;
      if ((cinfo->Ss != 0) && ((*paiVar13)[0] < 0)) {
        pjVar3 = cinfo->err;
        pjVar3->msg_code = 0x73;
        (pjVar3->msg_parm).i[0] = iVar1;
        (cinfo->err->msg_parm).i[1] = 0;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
      }
      iVar6 = cinfo->Ss;
      if (0 < iVar6) {
        iVar6 = 1;
      }
      lVar7 = (long)iVar6 + -1;
      do {
        iVar6 = 0;
        if (1 < cinfo->input_scan_number) {
          iVar6 = (*paiVar13)[lVar7 + 1];
        }
        paiVar4[iVar14 + iVar1][lVar7 + 1] = iVar6;
        uVar11 = (ulong)(uint)cinfo->Se;
        if (cinfo->Se < 10) {
          uVar11 = 9;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (long)uVar11);
      iVar14 = cinfo->Ss;
      if (iVar14 <= cinfo->Se) {
        lVar7 = (long)iVar14 + -1;
        do {
          iVar6 = (*paiVar13)[lVar7 + 1];
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          if (cinfo->Ah != iVar6) {
            pjVar3 = cinfo->err;
            pjVar3->msg_code = 0x73;
            (pjVar3->msg_parm).i[0] = iVar1;
            (cinfo->err->msg_parm).i[1] = iVar14;
            (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
          }
          (*paiVar13)[lVar7 + 1] = cinfo->Al;
          lVar7 = lVar7 + 1;
          iVar14 = iVar14 + 1;
        } while (lVar7 < cinfo->Se);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < cinfo->comps_in_scan);
  }
  if (cinfo->Ah == 0) {
    if (cinfo->Ss == 0) {
      pcVar8 = decode_mcu_DC_first;
    }
    else {
      pcVar8 = decode_mcu_AC_first;
    }
  }
  else if (cinfo->Ss == 0) {
    pcVar8 = decode_mcu_DC_refine;
  }
  else {
    pcVar8 = decode_mcu_AC_refine;
  }
LAB_0013686e:
  pjVar2->decode_mcu = pcVar8;
  if (0 < cinfo->comps_in_scan) {
    lVar12 = 0;
    do {
      pjVar5 = cinfo->cur_comp_info[lVar12];
      if ((cinfo->progressive_mode == 0) || ((cinfo->Ss == 0 && (cinfo->Ah == 0)))) {
        iVar1 = pjVar5->dc_tbl_no;
        uVar11 = (ulong)iVar1;
        if (0xf < uVar11) {
          pjVar3 = cinfo->err;
          pjVar3->msg_code = 0x7d;
          (pjVar3->msg_parm).i[0] = iVar1;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        if ((&pjVar2[3].decode_mcu)[uVar11] == (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0)
        {
          p_Var9 = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)
                   (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x40);
          (&pjVar2[3].decode_mcu)[uVar11] = p_Var9;
        }
        p_Var9 = (&pjVar2[3].decode_mcu)[uVar11];
        *(undefined8 *)(p_Var9 + 0x30) = 0;
        *(undefined8 *)(p_Var9 + 0x38) = 0;
        *(undefined8 *)(p_Var9 + 0x20) = 0;
        *(undefined8 *)(p_Var9 + 0x28) = 0;
        *(undefined8 *)(p_Var9 + 0x10) = 0;
        *(undefined8 *)(p_Var9 + 0x18) = 0;
        *(undefined8 *)p_Var9 = 0;
        *(undefined8 *)(p_Var9 + 8) = 0;
        *(undefined4 *)(&pjVar2[1].field_0x14 + lVar12 * 4) = 0;
        *(undefined4 *)((long)&pjVar2[2].decode_mcu + lVar12 * 4 + 4) = 0;
      }
      if ((cinfo->progressive_mode == 0) || (cinfo->Ss != 0)) {
        iVar1 = pjVar5->ac_tbl_no;
        uVar11 = (ulong)iVar1;
        if (0xf < uVar11) {
          pjVar3 = cinfo->err;
          pjVar3->msg_code = 0x7d;
          (pjVar3->msg_parm).i[0] = iVar1;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        if (*(long *)(&pjVar2[8].insufficient_data + uVar11 * 2) == 0) {
          pvVar10 = (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x100);
          *(void **)(&pjVar2[8].insufficient_data + uVar11 * 2) = pvVar10;
        }
        memset(*(void **)(&pjVar2[8].insufficient_data + uVar11 * 2),0,0x100);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < cinfo->comps_in_scan);
  }
  pjVar2[1].start_pass = (_func_void_j_decompress_ptr *)0x0;
  pjVar2[1].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0;
  pjVar2[1].insufficient_data = -0x10;
  pjVar2->insufficient_data = 0;
  *(uint *)((long)&pjVar2[3].start_pass + 4) = cinfo->restart_interval;
  return;
}

Assistant:

METHODDEF(void)
start_pass(j_decompress_ptr cinfo)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  int ci, tbl;
  jpeg_component_info *compptr;

  if (cinfo->progressive_mode) {
    /* Validate progressive scan parameters */
    if (cinfo->Ss == 0) {
      if (cinfo->Se != 0)
        goto bad;
    } else {
      /* need not check Ss/Se < 0 since they came from unsigned bytes */
      if (cinfo->Se < cinfo->Ss || cinfo->Se > DCTSIZE2 - 1)
        goto bad;
      /* AC scans may have only one component */
      if (cinfo->comps_in_scan != 1)
        goto bad;
    }
    if (cinfo->Ah != 0) {
      /* Successive approximation refinement scan: must have Al = Ah-1. */
      if (cinfo->Ah - 1 != cinfo->Al)
        goto bad;
    }
    if (cinfo->Al > 13) {       /* need not check for < 0 */
bad:
      ERREXIT4(cinfo, JERR_BAD_PROGRESSION,
               cinfo->Ss, cinfo->Se, cinfo->Ah, cinfo->Al);
    }
    /* Update progression status, and verify that scan order is legal.
     * Note that inter-scan inconsistencies are treated as warnings
     * not fatal errors ... not clear if this is right way to behave.
     */
    for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
      int coefi, cindex = cinfo->cur_comp_info[ci]->component_index;
      int *coef_bit_ptr = &cinfo->coef_bits[cindex][0];
      int *prev_coef_bit_ptr =
        &cinfo->coef_bits[cindex + cinfo->num_components][0];
      if (cinfo->Ss && coef_bit_ptr[0] < 0) /* AC without prior DC scan */
        WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, 0);
      for (coefi = MIN(cinfo->Ss, 1); coefi <= MAX(cinfo->Se, 9); coefi++) {
        if (cinfo->input_scan_number > 1)
          prev_coef_bit_ptr[coefi] = coef_bit_ptr[coefi];
        else
          prev_coef_bit_ptr[coefi] = 0;
      }
      for (coefi = cinfo->Ss; coefi <= cinfo->Se; coefi++) {
        int expected = (coef_bit_ptr[coefi] < 0) ? 0 : coef_bit_ptr[coefi];
        if (cinfo->Ah != expected)
          WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, coefi);
        coef_bit_ptr[coefi] = cinfo->Al;
      }
    }
    /* Select MCU decoding routine */
    if (cinfo->Ah == 0) {
      if (cinfo->Ss == 0)
        entropy->pub.decode_mcu = decode_mcu_DC_first;
      else
        entropy->pub.decode_mcu = decode_mcu_AC_first;
    } else {
      if (cinfo->Ss == 0)
        entropy->pub.decode_mcu = decode_mcu_DC_refine;
      else
        entropy->pub.decode_mcu = decode_mcu_AC_refine;
    }
  } else {
    /* Check that the scan parameters Ss, Se, Ah/Al are OK for sequential JPEG.
     * This ought to be an error condition, but we make it a warning.
     */
    if (cinfo->Ss != 0 || cinfo->Ah != 0 || cinfo->Al != 0 ||
        (cinfo->Se < DCTSIZE2 && cinfo->Se != DCTSIZE2 - 1))
      WARNMS(cinfo, JWRN_NOT_SEQUENTIAL);
    /* Select MCU decoding routine */
    entropy->pub.decode_mcu = decode_mcu;
  }

  /* Allocate & initialize requested statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    if (!cinfo->progressive_mode || (cinfo->Ss == 0 && cinfo->Ah == 0)) {
      tbl = compptr->dc_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
        ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->dc_stats[tbl] == NULL)
        entropy->dc_stats[tbl] = (unsigned char *)(*cinfo->mem->alloc_small)
          ((j_common_ptr)cinfo, JPOOL_IMAGE, DC_STAT_BINS);
      MEMZERO(entropy->dc_stats[tbl], DC_STAT_BINS);
      /* Initialize DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    if (!cinfo->progressive_mode || cinfo->Ss) {
      tbl = compptr->ac_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
        ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->ac_stats[tbl] == NULL)
        entropy->ac_stats[tbl] = (unsigned char *)(*cinfo->mem->alloc_small)
          ((j_common_ptr)cinfo, JPOOL_IMAGE, AC_STAT_BINS);
      MEMZERO(entropy->ac_stats[tbl], AC_STAT_BINS);
    }
  }

  /* Initialize arithmetic decoding variables */
  entropy->c = 0;
  entropy->a = 0;
  entropy->ct = -16;    /* force reading 2 initial bytes to fill C */
  entropy->pub.insufficient_data = FALSE;

  /* Initialize restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;
}